

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.hpp
# Opt level: O0

string * __thiscall
vkt::tessellation::
elemsStr<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
          (string *__return_storage_ptr__,tessellation *this,
          __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *begin,
          __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *end,
          int wrapLengthParam,int numIndentationSpaces)

{
  bool bVar1;
  difference_type dVar2;
  reference value;
  int local_2bc;
  allocator<char> local_289;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  byte local_242;
  allocator<char> local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_1c0;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> it;
  int index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_c9;
  float *local_c8;
  float *local_c0;
  int local_b4;
  int local_b0;
  int length;
  int wrapLength;
  undefined1 local_88 [8];
  string deepIndentation;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string baseIndentation;
  int bigInt;
  int numIndentationSpaces_local;
  int wrapLengthParam_local;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *end_local;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *begin_local;
  string *result;
  
  local_2bc = (int)end;
  baseIndentation.field_2._12_4_ = 0x7fffffff;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,(long)wrapLengthParam,' ',&local_51);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wrapLength,4,' ',(allocator<char> *)((long)&length + 3));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wrapLength);
  std::__cxx11::string::~string((string *)&wrapLength);
  std::allocator<char>::~allocator((allocator<char> *)((long)&length + 3));
  if (local_2bc < 1) {
    local_2bc = 0x7fffffff;
  }
  local_b0 = local_2bc;
  local_c0 = *(float **)this;
  local_c8 = begin->_M_current;
  dVar2 = std::
          distance<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                    ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                     local_c0,(__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                               )local_c8);
  local_b4 = (int)dVar2;
  local_c9 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (local_b0 < local_b4) {
    de::toString<int>(&local_130,&local_b4);
    std::operator+(&local_110,"(amount: ",&local_130);
    std::operator+(&local_f0,&local_110,") ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
  }
  std::__cxx11::string::string((string *)&local_190);
  std::operator+(&local_170,&local_190,"{");
  it._M_current._6_1_ = 0;
  if (local_b0 < local_b4) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,"\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  }
  else {
    std::allocator<char>::allocator();
    it._M_current._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&index," ",(allocator<char> *)((long)&it._M_current + 7));
  }
  std::operator+(&local_150,&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&index);
  if ((it._M_current._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  }
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  it._M_current._0_4_ = 0;
  local_1c0._M_current = *(float **)this;
  while (bVar1 = __gnu_cxx::operator!=(&local_1c0,begin), bVar1) {
    bVar1 = __gnu_cxx::operator!=
                      (&local_1c0,
                       (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                        *)this);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_220);
      std::operator+(&local_200,&local_220,", ");
      local_242 = 0;
      if ((int)it._M_current % local_b0 == 0) {
        std::operator+(&local_240,"\n",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                      );
      }
      else {
        std::allocator<char>::allocator();
        local_242 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"",&local_241);
      }
      std::operator+(&local_1e0,&local_200,&local_240);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_240);
      if ((local_242 & 1) != 0) {
        std::allocator<char>::~allocator(&local_241);
      }
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
    }
    value = __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
            ::operator*(&local_1c0);
    de::toString<float>(&local_268,value);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    it._M_current._0_4_ = (int)it._M_current + 1;
    __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
    operator++(&local_1c0);
  }
  bVar1 = local_b4 <= local_b0;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_288," ",&local_289);
  }
  else {
    std::operator+(&local_288,"\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  if (bVar1) {
    std::allocator<char>::~allocator(&local_289);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}");
  local_c9 = 1;
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string elemsStr (const IterT& begin, const IterT& end, int wrapLengthParam = 0, int numIndentationSpaces = 0)
{
	const int			bigInt			= ~0u/2;
	const std::string	baseIndentation	= std::string(numIndentationSpaces, ' ');
	const std::string	deepIndentation	= baseIndentation + std::string(4, ' ');
	const int			wrapLength		= wrapLengthParam > 0 ? wrapLengthParam : bigInt;
	const int			length			= static_cast<int>(std::distance(begin, end));
	std::string			result;

	if (length > wrapLength)
		result += "(amount: " + de::toString(length) + ") ";
	result += std::string() + "{" + (length > wrapLength ? "\n"+deepIndentation : " ");

	{
		int index = 0;
		for (IterT it = begin; it != end; ++it)
		{
			if (it != begin)
				result += std::string() + ", " + (index % wrapLength == 0 ? "\n"+deepIndentation : "");
			result += de::toString(*it);
			index++;
		}

		result += length > wrapLength ? "\n"+baseIndentation : " ";
	}

	result += "}";
	return result;
}